

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrolling_group.cpp
# Opt level: O0

int h_scroll_value_2_proc(Am_Object *self)

{
  int iVar1;
  Am_Value *pAVar2;
  int local_1c;
  int val;
  Am_Object group;
  Am_Object *self_local;
  
  group.data = (Am_Object_Data *)self;
  Am_Object::Get_Owner((Am_Object *)&stack0xffffffffffffffe8,(Am_Slot_Flags)self);
  pAVar2 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffe8,0x18e,0);
  local_1c = Am_Value::operator_cast_to_int(pAVar2);
  pAVar2 = Am_Object::Get((Am_Object *)&stack0xffffffffffffffe8,0x1c1,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar2);
  local_1c = local_1c - iVar1;
  if (local_1c < 1) {
    local_1c = 1;
  }
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffe8);
  return local_1c;
}

Assistant:

Am_Define_Formula(int, h_scroll_value_2)
{
  Am_Object group = self.Get_Owner();
  int val = (int)group.Get(Am_INNER_WIDTH) - (int)group.Get(Am_CLIP_WIDTH);
  if (val < 1)
    val = 1;
  return val;
}